

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O0

void t42_glyphslot_clear(FT_GlyphSlot slot)

{
  FT_GlyphSlot slot_local;
  
  ft_glyphslot_free_bitmap(slot);
  memset(&slot->metrics,0,0x40);
  memset(&slot->outline,0,0x28);
  memset(&slot->bitmap,0,0x28);
  slot->bitmap_left = 0;
  slot->bitmap_top = 0;
  slot->num_subglyphs = 0;
  slot->subglyphs = (FT_SubGlyph)0x0;
  slot->control_data = (void *)0x0;
  slot->control_len = 0;
  slot->other = (void *)0x0;
  slot->format = FT_GLYPH_FORMAT_NONE;
  slot->linearHoriAdvance = 0;
  slot->linearVertAdvance = 0;
  return;
}

Assistant:

static void
  t42_glyphslot_clear( FT_GlyphSlot  slot )
  {
    /* free bitmap if needed */
    ft_glyphslot_free_bitmap( slot );

    /* clear all public fields in the glyph slot */
    FT_ZERO( &slot->metrics );
    FT_ZERO( &slot->outline );
    FT_ZERO( &slot->bitmap );

    slot->bitmap_left   = 0;
    slot->bitmap_top    = 0;
    slot->num_subglyphs = 0;
    slot->subglyphs     = NULL;
    slot->control_data  = NULL;
    slot->control_len   = 0;
    slot->other         = NULL;
    slot->format        = FT_GLYPH_FORMAT_NONE;

    slot->linearHoriAdvance = 0;
    slot->linearVertAdvance = 0;
  }